

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerIdPointsToSet.h
# Opt level: O0

bool __thiscall dg::pta::PointerIdPointsToSet::hasNullWithOffset(PointerIdPointsToSet *this)

{
  bool bVar1;
  type tVar2;
  Pointer *ptr;
  unsigned_long ptrid;
  const_iterator __end2;
  const_iterator __begin2;
  PointersT *__range2;
  const_iterator *in_stack_ffffffffffffffa8;
  const_iterator *in_stack_ffffffffffffffb0;
  
  ADT::
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
  ::begin((SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
           *)in_stack_ffffffffffffffb0);
  ADT::
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
  ::end((SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
         *)in_stack_ffffffffffffffb0);
  while( true ) {
    bVar1 = ADT::
            SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
            ::const_iterator::operator!=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (!bVar1) {
      return false;
    }
    in_stack_ffffffffffffffb0 =
         (const_iterator *)
         ADT::
         SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
         ::const_iterator::operator*(in_stack_ffffffffffffffb0);
    in_stack_ffffffffffffffa8 = (const_iterator *)getPointer(0x16cb9f);
    if (((in_stack_ffffffffffffffa8->container_it).
         super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur ==
         NULLPTR) &&
       (tVar2 = Offset::operator*((Offset *)&in_stack_ffffffffffffffa8->container_end), tVar2 != 0))
    break;
    ADT::
    SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
    ::const_iterator::operator++(in_stack_ffffffffffffffb0);
  }
  return true;
}

Assistant:

bool hasNullWithOffset() const {
        for (auto ptrid : pointers) {
            const auto &ptr = getPointer(ptrid);
            if (ptr.target == NULLPTR && *ptr.offset != 0) {
                return true;
            }
        }

        return false;
    }